

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger_tests.hpp
# Opt level: O0

void __thiscall TestLogger::voutput(TestLogger *this,char *fmt,__va_list_tag *va)

{
  undefined8 uStack_1048;
  va_list va2;
  char local_1028 [8];
  char buf [4096];
  __va_list_tag *va_local;
  char *fmt_local;
  TestLogger *this_local;
  
  memset(local_1028,0,0x1000);
  va2[0].overflow_arg_area = va->reg_save_area;
  uStack_1048._0_4_ = va->gp_offset;
  uStack_1048._4_4_ = va->fp_offset;
  va2[0]._0_8_ = va->overflow_arg_area;
  vsprintf(local_1028,fmt,&uStack_1048);
  std::__cxx11::string::operator+=((string *)&this->m_log,local_1028);
  iutest::detail::iuConsole::nl_voutput(fmt,va);
  return;
}

Assistant:

IUTEST_CXX_OVERRIDE IUTEST_ATTRIBUTE_FORMAT_PRINTF(2, 0)
    {
IUTEST_PRAGMA_CRT_SECURE_WARN_DISABLE_BEGIN()
        char buf[4096] = { 0 };
        va_list va2;
        iu_va_copy(va2, va);
        vsprintf(buf, fmt, va2);
        va_end(va2);
        m_log += buf;
        ::iutest::detail::iuConsole::nl_voutput(fmt, va);
IUTEST_PRAGMA_CRT_SECURE_WARN_DISABLE_END()
    }